

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_sizeof_CCtx(ZSTD_CCtx *cctx)

{
  ZSTD_localDict dict;
  long lVar1;
  size_t sVar2;
  long lVar3;
  ZSTD_CDict *in_RDI;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffe8;
  size_t local_8;
  
  if (in_RDI == (ZSTD_CDict *)0x0) {
    local_8 = 0;
  }
  else {
    lVar1 = 0x1478;
    if ((ZSTD_CDict *)(in_RDI->cBlockState).entropy.huf.CTable[0x1f] == in_RDI) {
      lVar1 = 0;
    }
    sVar2 = ZSTD_cwksp_sizeof((ZSTD_cwksp *)((in_RDI->cBlockState).entropy.huf.CTable + 0x1f));
    lVar3 = lVar1 + sVar2;
    dict.dict = (void *)lVar1;
    dict.dictBuffer = (void *)in_stack_ffffffffffffffd0;
    dict.dictSize = lVar3;
    dict._24_8_ = in_stack_ffffffffffffffe8;
    dict.cdict = in_RDI;
    sVar2 = ZSTD_sizeof_localDict(dict);
    lVar3 = lVar3 + sVar2;
    local_8 = ZSTD_sizeof_mtctx((ZSTD_CCtx *)0x1e4358);
    local_8 = lVar3 + local_8;
  }
  return local_8;
}

Assistant:

size_t ZSTD_sizeof_CCtx(const ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support sizeof on NULL */
    /* cctx may be in the workspace */
    return (cctx->workspace.workspace == cctx ? 0 : sizeof(*cctx))
           + ZSTD_cwksp_sizeof(&cctx->workspace)
           + ZSTD_sizeof_localDict(cctx->localDict)
           + ZSTD_sizeof_mtctx(cctx);
}